

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O3

Float<unsigned_long,_11,_52,_1023,_3U>
tcu::Float<unsigned_long,11,52,1023,3u>::convert<unsigned_int,5,5,15,2u>
          (Float<unsigned_int,_5,_5,_15,_2U> *other)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  Float<unsigned_long,_11,_52,_1023,_3U> FVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = other->m_value;
  if ((uVar1 & 0x3ff) == 0x3e0) {
    FVar4.m_value = 0xfff0000000000000;
    if ((uVar1 >> 10 & 1) == 0) {
      FVar4.m_value = 0x7ff0000000000000;
    }
    return (Float<unsigned_long,_11,_52,_1023,_3U>)FVar4.m_value;
  }
  uVar5 = uVar1 & 0x1f;
  if ((uVar1 & 0x3e0) != 0x3e0 || uVar5 == 0) {
    if ((uVar1 & 0x3ff) == 0) {
      return (Float<unsigned_long,_11,_52,_1023,_3U>)((ulong)uVar1 << 0x35);
    }
    uVar6 = uVar5 + 0x20;
    if ((uVar1 & 0x3e0) == 0 && uVar5 != 0) {
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar6 = uVar5 << (~(byte)lVar2 + 6 & 0x3f);
      iVar3 = ((uint)lVar2 ^ 0xffffffc0) + 0x2d;
    }
    else {
      iVar3 = (uVar1 >> 5 & 0x1f) - 0xf;
    }
    return (Float<unsigned_long,_11,_52,_1023,_3U>)
           ((ulong)(iVar3 + 0x3ff) << 0x34 | (ulong)(uVar1 & 0x400) << 0x35 |
           (ulong)(uVar6 & 0xffdf) << 0x2f);
  }
  return (Float<unsigned_long,_11,_52,_1023,_3U>)0x7fffffffffffffff;
}

Assistant:

inline StorageType		exponentBits	(void) const	{ return (m_value >> MantissaBits) & ((StorageType(1)<<ExponentBits)-1);	}